

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O0

int X509_add1_reject_object(X509 *x,ASN1_OBJECT *obj)

{
  bool bVar1;
  enable_if_t<_internal::StackTraits<stack_st_ASN1_OBJECT>::kIsConst,_bool> eVar2;
  ASN1_OBJECT *__p;
  stack_st_ASN1_OBJECT *psVar3;
  unique_ptr<asn1_object_st,_bssl::internal::Deleter> local_40;
  X509_CERT_AUX *local_38;
  X509_CERT_AUX *aux;
  unique_ptr<asn1_object_st,_bssl::internal::Deleter> local_28;
  UniquePtr<ASN1_OBJECT> objtmp;
  ASN1_OBJECT *obj_local;
  X509 *x_local;
  
  objtmp._M_t.super___uniq_ptr_impl<asn1_object_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_asn1_object_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_asn1_object_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<asn1_object_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<asn1_object_st,_bssl::internal::Deleter,_true,_true>)obj;
  __p = OBJ_dup(obj);
  std::unique_ptr<asn1_object_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_object_st,bssl::internal::Deleter> *)&local_28,(pointer)__p);
  bVar1 = std::operator==(&local_28,(nullptr_t)0x0);
  if (bVar1) {
    x_local._4_4_ = 0;
  }
  else {
    local_38 = aux_get((X509 *)x);
    if (local_38->reject == (stack_st_ASN1_OBJECT *)0x0) {
      psVar3 = sk_ASN1_OBJECT_new_null();
      local_38->reject = psVar3;
      if (local_38->reject == (stack_st_ASN1_OBJECT *)0x0) {
        x_local._4_4_ = 0;
        goto LAB_0025cbce;
      }
    }
    psVar3 = local_38->reject;
    std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::unique_ptr(&local_40,&local_28);
    eVar2 = bssl::PushToStack<stack_st_ASN1_OBJECT>(psVar3,&local_40);
    x_local._4_4_ = (uint)eVar2;
    std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  }
LAB_0025cbce:
  aux._4_4_ = 1;
  std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return x_local._4_4_;
}

Assistant:

int X509_add1_reject_object(X509 *x, const ASN1_OBJECT *obj) {
  bssl::UniquePtr<ASN1_OBJECT> objtmp(OBJ_dup(obj));
  if (objtmp == nullptr) {
    return 0;
  }
  X509_CERT_AUX *aux = aux_get(x);
  if (aux->reject == nullptr) {
    aux->reject = sk_ASN1_OBJECT_new_null();
    if (aux->reject == nullptr) {
      return 0;
    }
  }
  return bssl::PushToStack(aux->reject, std::move(objtmp));
}